

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDErrorReporter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XSDErrorReporter::emitError
          (XSDErrorReporter *this,uint toEmit,XMLCh *msgDomain,Locator *aLocator,XMLCh *text1,
          XMLCh *text2,XMLCh *text3,XMLCh *text4,MemoryManager *manager)

{
  XMLErrorReporter *pXVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint *puVar7;
  ErrTypes local_1054;
  long *plStack_1050;
  ErrTypes errType;
  XMLMsgLoader *msgLoader;
  XMLCh errText [2048];
  XMLSize_t maxChars;
  XMLCh *text2_local;
  XMLCh *text1_local;
  Locator *aLocator_local;
  XMLCh *msgDomain_local;
  uint toEmit_local;
  XSDErrorReporter *this_local;
  
  errText[0x7fc] = L'߿';
  errText[0x7fd] = L'\0';
  errText[0x7fe] = L'\0';
  errText[0x7ff] = L'\0';
  plStack_1050 = gErrMsgLoader;
  local_1054 = XMLErrs::errorType(toEmit);
  bVar2 = XMLString::equals(msgDomain,(XMLCh *)XMLUni::fgValidityDomain);
  if (bVar2) {
    local_1054 = XMLValid::errorType(toEmit);
    plStack_1050 = gValidMsgLoader;
  }
  (**(code **)(*plStack_1050 + 0x18))
            (plStack_1050,toEmit,&msgLoader,0x7ff,text1,text2,text3,text4,manager);
  if (this->fErrorReporter != (XMLErrorReporter *)0x0) {
    pXVar1 = this->fErrorReporter;
    iVar3 = (*aLocator->_vptr_Locator[3])();
    iVar4 = (*aLocator->_vptr_Locator[2])();
    iVar5 = (*aLocator->_vptr_Locator[4])();
    iVar6 = (*aLocator->_vptr_Locator[5])();
    (*pXVar1->_vptr_XMLErrorReporter[2])
              (pXVar1,(ulong)toEmit,msgDomain,(ulong)local_1054,&msgLoader,
               CONCAT44(extraout_var,iVar3),CONCAT44(extraout_var_00,iVar4),
               CONCAT44(extraout_var_01,iVar5),CONCAT44(extraout_var_02,iVar6));
  }
  if ((local_1054 == ErrType_Fatal) && ((this->fExitOnFirstFatal & 1U) != 0)) {
    puVar7 = (uint *)__cxa_allocate_exception(4);
    *puVar7 = toEmit;
    __cxa_throw(puVar7,&XMLErrs::Codes::typeinfo,0);
  }
  return;
}

Assistant:

void XSDErrorReporter::emitError(const unsigned int toEmit,
                                 const XMLCh* const msgDomain,
                                 const Locator* const aLocator,
                                 const XMLCh* const text1,
                                 const XMLCh* const text2,
                                 const XMLCh* const text3,
                                 const XMLCh* const text4,
                                 MemoryManager* const manager)
{
    // Bump the error count if it is not a warning
//    if (XMLErrs::errorType(toEmit) != XMLErrorReporter::ErrType_Warning)
//        incrementErrorCount();

    //
    //  Load the message into alocal and replace any tokens found in
    //  the text.
    //
    const XMLSize_t maxChars = 2047;
    XMLCh errText[maxChars + 1];
    XMLMsgLoader* msgLoader = gErrMsgLoader;
    XMLErrorReporter::ErrTypes errType = XMLErrs::errorType((XMLErrs::Codes) toEmit);

    if (XMLString::equals(msgDomain, XMLUni::fgValidityDomain)) {

        errType = XMLValid::errorType((XMLValid::Codes) toEmit);
        msgLoader = gValidMsgLoader;
    }

    if (!msgLoader->loadMsg(toEmit, errText, maxChars, text1, text2, text3, text4, manager))
    {
                // <TBD> Should probably load a default message here
    }

    if (fErrorReporter)
        fErrorReporter->error(toEmit, msgDomain, errType, errText, aLocator->getSystemId(),
                              aLocator->getPublicId(), aLocator->getLineNumber(),
                              aLocator->getColumnNumber());

    // Bail out if its fatal an we are to give up on the first fatal error
    if (errType == XMLErrorReporter::ErrType_Fatal && fExitOnFirstFatal)
        throw (XMLErrs::Codes) toEmit;
}